

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_constant_wnaf(secp256k1_scalar *number,int w)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  secp256k1_scalar local_4b8;
  secp256k1_scalar num;
  secp256k1_scalar scalar_skew;
  secp256k1_scalar shift;
  int wnaf [256];
  
  memset(wnaf,0,0x400);
  num.d[0] = number->d[0];
  num.d[1] = number->d[1];
  num.d[2] = number->d[2];
  num.d[3] = number->d[3];
  uVar4 = (ulong)(uint)w;
  uVar2 = 1 << ((byte)w & 0x1f);
  shift.d[0] = (uint64_t)uVar2;
  local_4b8.d[0] = 0;
  local_4b8.d[1] = 0;
  shift.d[3] = 0;
  local_4b8.d[2] = 0;
  local_4b8.d[3] = 0;
  shift.d[1] = 0;
  shift.d[2] = 0;
  iVar7 = 0x10;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    secp256k1_scalar_shr_int(&num,8);
  }
  uVar3 = secp256k1_wnaf_const(wnaf,&num,w,(int)uVar4);
  uVar4 = (long)(w + 0x7f) / (long)w & 0xffffffff;
  do {
    if ((int)uVar4 < 0) {
      scalar_skew.d[0] = (uint64_t)uVar3;
      scalar_skew.d[1] = 0;
      scalar_skew.d[2] = 0;
      scalar_skew.d[3] = 0;
      secp256k1_scalar_add(&num,&num,&scalar_skew);
      if ((((local_4b8.d[0] == num.d[0]) && (local_4b8.d[1] == num.d[1])) &&
          (local_4b8.d[2] == num.d[2])) && (local_4b8.d[3] == num.d[3])) {
        return;
      }
      pcVar6 = "test condition failed: secp256k1_scalar_eq(&x, &num)";
      uVar5 = 0x1560;
LAB_0012f3af:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,uVar5,pcVar6);
      abort();
    }
    uVar1 = wnaf[uVar4];
    if ((ulong)uVar1 == 0) {
      pcVar6 = "test condition failed: v != 0";
      uVar5 = 0x154f;
      goto LAB_0012f3af;
    }
    if ((uVar1 & 1) == 0) {
      pcVar6 = "test condition failed: v & 1";
      uVar5 = 0x1550;
      goto LAB_0012f3af;
    }
    if (uVar1 == -uVar2 || SBORROW4(uVar1,-uVar2) != (int)(uVar1 + uVar2) < 0) {
      pcVar6 = "test condition failed: v > -(1 << w)";
      uVar5 = 0x1551;
      goto LAB_0012f3af;
    }
    if ((int)uVar2 <= (int)uVar1) {
      pcVar6 = "test condition failed: v < (1 << w)";
      uVar5 = 0x1552;
      goto LAB_0012f3af;
    }
    secp256k1_scalar_mul(&local_4b8,&local_4b8,&shift);
    if ((int)uVar1 < 0) {
      scalar_skew.d[0] = (uint64_t)-uVar1;
      scalar_skew.d[1] = 0;
      scalar_skew.d[2] = 0;
      scalar_skew.d[3] = 0;
      secp256k1_scalar_negate(&scalar_skew,&scalar_skew);
    }
    else {
      scalar_skew.d[1] = 0;
      scalar_skew.d[2] = 0;
      scalar_skew.d[3] = 0;
      scalar_skew.d[0] = (ulong)uVar1;
    }
    secp256k1_scalar_add(&local_4b8,&local_4b8,&scalar_skew);
    uVar4 = (ulong)((int)uVar4 - 1);
  } while( true );
}

Assistant:

static void test_constant_wnaf(const secp256k1_scalar *number, int w) {
    secp256k1_scalar x, shift;
    int wnaf[256] = {0};
    int i;
    int skew;
    int bits = 256;
    secp256k1_scalar num = *number;
    secp256k1_scalar scalar_skew;

    secp256k1_scalar_set_int(&x, 0);
    secp256k1_scalar_set_int(&shift, 1 << w);
    for (i = 0; i < 16; ++i) {
        secp256k1_scalar_shr_int(&num, 8);
    }
    bits = 128;
    skew = secp256k1_wnaf_const(wnaf, &num, w, bits);

    for (i = WNAF_SIZE_BITS(bits, w); i >= 0; --i) {
        secp256k1_scalar t;
        int v = wnaf[i];
        CHECK(v != 0); /* check nonzero */
        CHECK(v & 1);  /* check parity */
        CHECK(v > -(1 << w)); /* check range above */
        CHECK(v < (1 << w));  /* check range below */

        secp256k1_scalar_mul(&x, &x, &shift);
        if (v >= 0) {
            secp256k1_scalar_set_int(&t, v);
        } else {
            secp256k1_scalar_set_int(&t, -v);
            secp256k1_scalar_negate(&t, &t);
        }
        secp256k1_scalar_add(&x, &x, &t);
    }
    /* Skew num because when encoding numbers as odd we use an offset */
    secp256k1_scalar_set_int(&scalar_skew, skew);
    secp256k1_scalar_add(&num, &num, &scalar_skew);
    CHECK(secp256k1_scalar_eq(&x, &num));
}